

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_CallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
          *playout,RecyclableObject *function,uint flags,AuxArray<unsigned_int> *spreadIndices)

{
  byte bVar1;
  short sVar2;
  ThreadContext *pTVar3;
  long lVar4;
  InterpreterStackFrame *pIVar5;
  code *pcVar6;
  bool bVar7;
  ArgSlot AVar8;
  RegSlot RVar9;
  RegSlot RVar10;
  undefined4 *puVar11;
  Var value;
  JavascriptMethod p_Var12;
  undefined8 *puVar13;
  uint count;
  Type TVar14;
  Type TVar15;
  Arguments local_98;
  Arguments local_88;
  Arguments local_78;
  Arguments local_68;
  ThreadContext *local_58;
  AuxArray<unsigned_int> *local_50;
  Type local_48;
  RecyclableObject *local_40;
  ImplicitCallFlags local_32;
  bool local_31;
  
  pTVar3 = (*(ScriptContext **)(this + 0x78))->threadContext;
  local_32 = pTVar3->implicitCallFlags;
  lVar4 = *(long *)(*(long *)(this + 0x88) + 0x20);
  local_50 = spreadIndices;
  if (((*(long *)(lVar4 + 0x80) != 0) || ((*(byte *)(lVar4 + 0xa8) & 0x20) != 0)) &&
     ((*(byte *)(lVar4 + 0xa8) & 0x40) != 0)) {
    JavascriptFunction::CheckValidDebugThunk(*(ScriptContext **)(this + 0x78),function);
  }
  bVar1 = (playout->super_OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
          super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.ArgCount;
  count = (uint)bVar1;
  local_31 = pTVar3->isInReentrancySafeRegion;
  pTVar3->isInReentrancySafeRegion = true;
  local_48 = *(Type *)(this + 0x28);
  local_58 = pTVar3;
  local_40 = function;
  if ((playout->super_OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
      super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.Return == -1) {
    if (0xff < flags) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0xf7d,"(static_cast<unsigned>(args.Info.Flags) == flags)",
                                  "Flags don\'t fit into the CallInfo field?");
      if (!bVar7) goto LAB_00a7d7a9;
      *puVar11 = 0;
    }
    AVar8 = CallInfo::GetArgCountWithExtraArgs
                      (flags & (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                                CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                               CallFlags_New) | CallFlags_NotUsed,count);
    TVar15._0_4_ = (flags | 0x10) << 0x18 | count;
    TVar15._4_4_ = 0;
    if (local_50 == (AuxArray<unsigned_int> *)0x0) {
      p_Var12 = RecyclableObject::GetEntryPoint(local_40);
      local_88.Values = local_48;
      local_88.Info = TVar15;
      JavascriptFunction::CallFunction<true>(local_40,p_Var12,&local_88,false);
    }
    else {
      local_98.Values = local_48;
      local_98.Info = TVar15;
      JavascriptFunction::CallSpreadFunction(local_40,&local_98,local_50);
    }
  }
  else {
    if (0xff < flags) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0xf8c,"(static_cast<unsigned>(args.Info.Flags) == flags)",
                                  "Flags don\'t fit into the CallInfo field?");
      if (!bVar7) goto LAB_00a7d7a9;
      *puVar11 = 0;
    }
    AVar8 = CallInfo::GetArgCountWithExtraArgs
                      (flags & (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                                CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                               CallFlags_New) | CallFlags_Value,count);
    TVar14._0_4_ = (flags | 2) << 0x18 | (uint)bVar1;
    TVar14._4_4_ = 0;
    sVar2 = (playout->super_OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
            super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.Return;
    if (local_50 == (AuxArray<unsigned_int> *)0x0) {
      p_Var12 = RecyclableObject::GetEntryPoint(local_40);
      local_68.Values = local_48;
      local_68.Info = TVar14;
      value = JavascriptFunction::CallFunction<true>(local_40,p_Var12,&local_68,false);
    }
    else {
      local_78.Values = local_48;
      local_78.Info = TVar14;
      value = JavascriptFunction::CallSpreadFunction(local_40,&local_78,local_50);
    }
    SetReg<unsigned_int>(this,(int)sVar2,value);
  }
  local_58->isInReentrancySafeRegion = local_31;
  local_58->implicitCallFlags = local_32;
  if ((ArgSlot)(AVar8 + 1) == 0) {
    ::Math::DefaultOverflowPolicy();
  }
  puVar13 = (undefined8 *)(*(long *)(this + 0x30) + (ulong)(ushort)(AVar8 + 1) * -8);
  *(undefined8 **)(this + 0x30) = puVar13;
  *(undefined8 *)(this + 0x28) = *puVar13;
  RVar9 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
  pIVar5 = *(InterpreterStackFrame **)(this + 0x30);
  if (this + (ulong)RVar9 * 8 + 0x160 <= pIVar5) {
    RVar9 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
    RVar10 = FunctionBody::GetOutParamMaxDepth(*(FunctionBody **)(this + 0x88));
    if (pIVar5 < this + (ulong)RVar10 * 8 + (ulong)RVar9 * 8 + 0x160) {
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar11 = 1;
  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x9ac,
                              "(m_localSlots + this->m_functionBody->GetLocalsCount() <= m_outSp && m_outSp < (m_localSlots + this->m_functionBody->GetLocalsCount() + this->m_functionBody->GetOutParamMaxDepth()))"
                              ,"out args Stack pointer not in range after Pop");
  if (bVar7) {
    *puVar11 = 0;
    return;
  }
LAB_00a7d7a9:
  pcVar6 = (code *)invalidInstructionException();
  (*pcVar6)();
}

Assistant:

void InterpreterStackFrame::OP_CallCommon(const unaligned T * playout, RecyclableObject * function, unsigned flags, const Js::AuxArray<uint32> *spreadIndices)
    {
        // Always save and restore implicit call flags when calling out
        // REVIEW: Can we avoid it if we don't collect dynamic profile info?
        ThreadContext * threadContext = scriptContext->GetThreadContext();
        Js::ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();

#ifdef ENABLE_SCRIPT_DEBUGGING
#if DBG
        if (this->IsInDebugMode())
        {
            JavascriptFunction::CheckValidDebugThunk(scriptContext, function);
        }
#endif
#endif
        ArgSlot argCount = playout->ArgCount;
        BEGIN_SAFE_REENTRANT_REGION(threadContext)
        {
            if (playout->Return == Js::Constants::NoRegister)
            {
                flags |= CallFlags_NotUsed;
                Arguments args(CallInfo((CallFlags)flags, argCount), m_outParams);
                AssertMsg(static_cast<unsigned>(args.Info.Flags) == flags, "Flags don't fit into the CallInfo field?");
                argCount = args.GetArgCountWithExtraArgs();
                if (spreadIndices != nullptr)
                {
                    JavascriptFunction::CallSpreadFunction(function, args, spreadIndices);
                }
                else
                {
                    JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), args);
                }
            }
            else
            {
                flags |= CallFlags_Value;
                Arguments args(CallInfo((CallFlags)flags, argCount), m_outParams);
                AssertMsg(static_cast<unsigned>(args.Info.Flags) == flags, "Flags don't fit into the CallInfo field?");
                argCount = args.GetArgCountWithExtraArgs();
                if (spreadIndices != nullptr)
                {
                    SetReg((RegSlot)playout->Return, JavascriptFunction::CallSpreadFunction(function, args, spreadIndices));
                }
                else
                {
                    SetReg((RegSlot)playout->Return, JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), args));
                }
            }
        }
        END_SAFE_REENTRANT_REGION

            threadContext->SetImplicitCallFlags(savedImplicitCallFlags);
        PopOut(argCount);
    }